

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intrinsics.cpp
# Opt level: O1

Pass * wasm::createIntrinsicLoweringPass(void)

{
  Pass *__s;
  
  __s = (Pass *)operator_new(0x130);
  memset(__s,0,0x130);
  __s->runner = (PassRunner *)0x0;
  (__s->name)._M_dataplus._M_p = (pointer)&(__s->name).field_2;
  (__s->name)._M_string_length = 0;
  (__s->name).field_2._M_local_buf[0] = '\0';
  (__s->passArg).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  __s[1]._vptr_Pass = (_func_int **)0x0;
  __s[1].runner = (PassRunner *)0x0;
  __s[3]._vptr_Pass = (_func_int **)0x0;
  __s[3].runner = (PassRunner *)0x0;
  __s[3].name._M_dataplus._M_p = (pointer)0x0;
  __s[3].name._M_string_length = 0;
  __s[3].name.field_2._M_allocated_capacity = 0;
  __s->_vptr_Pass = (_func_int **)&PTR__WalkerPass_01093060;
  return __s;
}

Assistant:

Pass* createIntrinsicLoweringPass() { return new IntrinsicLowering(); }